

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xml_attribute_struct **ppxVar3;
  char_t *string;
  
  if (this->_root != (xml_node_struct *)0x0) {
    ppxVar3 = &this->_root->first_attribute;
    while (pxVar1 = *ppxVar3, pxVar1 != (xml_attribute_struct *)0x0) {
      string = pxVar1->name;
      if (string == (char_t *)0x0) {
        string = "";
      }
      bVar2 = impl::anon_unknown_0::starts_with(string,"xmlns");
      if (bVar2) {
        if (pred.prefix == (char_t *)0x0) {
          if (string[5] == '\0') {
            return (xml_attribute)pxVar1;
          }
        }
        else if ((string[5] == ':') &&
                (bVar2 = impl::anon_unknown_0::strequalrange
                                   (string + 6,pred.prefix,pred.prefix_length), bVar2)) {
          return (xml_attribute)pxVar1;
        }
      }
      ppxVar3 = &pxVar1->next_attribute;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}